

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  bool bVar1;
  undefined4 uVar2;
  iterator iVar3;
  long lVar4;
  undefined8 *puVar5;
  __hashtable *p_Var6;
  undefined8 uVar7;
  pointer pdVar8;
  byte bVar9;
  initializer_list<double> __l;
  function<int_(double)> func;
  vector<double,_std::allocator<double>_> test;
  unordered_multimap<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  keyed;
  unordered_multimap<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  expectedKeyBy;
  undefined1 local_10a;
  undefined1 local_109;
  undefined8 local_108;
  undefined8 uStack_100;
  code *local_f8;
  code *local_f0;
  double local_e0;
  double local_d8;
  vector<double,_std::allocator<double>_> local_d0;
  __hashtable local_b8;
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  local_68;
  
  bVar9 = 0;
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)0x4000000000000000;
  local_b8._M_element_count = 0x4002666666666666;
  local_b8._M_buckets = (__buckets_ptr)0x3ff0000000000000;
  local_b8._M_bucket_count = 0x3ff3333333333333;
  local_b8._M_rehash_policy._M_max_load_factor = 0.0;
  local_b8._M_rehash_policy._4_4_ = 0x40080000;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_b8;
  std::vector<double,_std::allocator<double>_>::vector(&local_d0,__l,(allocator_type *)&local_68);
  local_108 = 0;
  uStack_100 = 0;
  local_f0 = std::
             _Function_handler<int_(double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/keyBy/main.cpp:13:33)>
             ::_M_invoke;
  local_f8 = std::
             _Function_handler<int_(double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/keyBy/main.cpp:13:33)>
             ::_M_manager;
  puVar5 = &DAT_00103060;
  p_Var6 = &local_b8;
  for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
    p_Var6->_M_buckets = (__buckets_ptr)*puVar5;
    puVar5 = puVar5 + (ulong)bVar9 * -2 + 1;
    p_Var6 = (__hashtable *)((long)p_Var6 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  std::
  _Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
  ::_Hashtable<std::pair<int_const,double>const*>
            ((_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
              *)&local_68,&local_b8,&local_68,0,&local_e0,&local_109,&local_10a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test keyBy...",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  local_b8._M_buckets = &local_b8._M_single_bucket;
  local_b8._M_bucket_count = 1;
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b8._M_element_count = 0;
  local_b8._M_rehash_policy._M_max_load_factor = 1.0;
  local_b8._M_rehash_policy._M_next_resize = 0;
  local_b8._M_single_bucket = (__node_base_ptr)0x0;
  if (local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar7 = 0;
    pdVar8 = local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_e0 = *pdVar8;
      if (local_f8 == (code *)0x0) {
        std::__throw_bad_function_call();
        goto LAB_00102521;
      }
      uVar2 = (*local_f0)(&local_108,&local_e0);
      local_d8 = *pdVar8;
      local_e0 = (double)CONCAT44(local_e0._4_4_,uVar2);
      iVar3 = std::
              _Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
              ::_M_emplace<std::pair<int_const,double>>
                        ((_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                          *)&local_b8,uVar7,&local_e0);
      uVar7 = *(undefined8 *)
               iVar3.super__Node_iterator_base<std::pair<const_int,_double>,_false>._M_cur;
      pdVar8 = pdVar8 + 1;
    } while (pdVar8 != local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  bVar1 = std::__detail::
          _Equality<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>,_false>
          ::_M_equal((_Equality<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>,_false>
                      *)&local_68,&local_b8);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"passed!",7);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
    std::
    _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
    ::~_Hashtable(&local_b8);
    std::
    _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
    ::~_Hashtable(&local_68);
    if (local_f8 != (code *)0x0) {
      (*local_f8)(&local_108,&local_108,3);
    }
    if (local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return 0;
  }
LAB_00102521:
  __assert_fail("expectedKeyBy==keyed",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/keyBy/main.cpp"
                ,0x17,"int main()");
}

Assistant:

int main(){
   
  vector<double> test={1.0, 1.2, 2.0, 2.3, 3.0};
  function< int(double) > func= [] (const double & element){return (int)element;};
  unordered_multimap<int, double> expectedKeyBy={
      make_pair(1,1.0),
      make_pair(1,1.2),
      make_pair(2,2.0),
      make_pair(2,2.3),
      make_pair(3, 3.0)      
  };
  cout << "Test keyBy..." << endl;
  auto keyed = Functional::keyBy(test,func); 
  assert( expectedKeyBy==keyed);
  cout << "passed!" << endl;
  

  return 0;

}